

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

void __thiscall QDomNamedNodeMapPrivate::clearMap(QDomNamedNodeMapPrivate *this)

{
  int *piVar1;
  ulong uVar2;
  uchar *puVar3;
  Data *pDVar4;
  ulong uVar5;
  
  if (this->appendToParent != false) {
LAB_001102eb:
    QMultiHash<QString,_QDomNodePrivate_*>::clear(&this->map);
    return;
  }
  pDVar4 = (this->map).d;
  if (pDVar4 == (Data *)0x0) {
    uVar5 = 0;
    puVar3 = (uchar *)0x0;
    pDVar4 = (Data *)0x0;
    goto LAB_001103a7;
  }
  if (pDVar4->spans->offsets[0] == 0xff) {
    uVar2 = 1;
    do {
      uVar5 = uVar2;
      if (pDVar4->numBuckets == uVar5) goto LAB_00110360;
      uVar2 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  }
  else {
    uVar5 = 0;
  }
LAB_00110363:
  do {
    if (pDVar4 == (Data *)0x0) {
      puVar3 = (uchar *)0x0;
    }
    else {
      puVar3 = pDVar4->spans[uVar5 >> 7].entries
               [pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].storage.data + 0x18;
    }
LAB_001103a7:
    while( true ) {
      if (puVar3 == (uchar *)0x0) goto LAB_001102eb;
      LOCK();
      piVar1 = (int *)(**(long **)puVar3 + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && ((long *)**(long **)puVar3 != (long *)0x0)) {
        (**(code **)(*(long *)**(long **)puVar3 + 8))();
      }
      if (*(long *)(*(long *)puVar3 + 8) == 0) break;
      puVar3 = (uchar *)(*(long *)puVar3 + 8);
    }
    do {
      if (pDVar4->numBuckets - 1 == uVar5) goto LAB_00110360;
      uVar5 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  } while( true );
LAB_00110360:
  uVar5 = 0;
  pDVar4 = (Data *)0x0;
  goto LAB_00110363;
}

Assistant:

void QDomNamedNodeMapPrivate::clearMap()
{
    // Dereference all of our children if we took references
    if (!appendToParent) {
        auto it = map.constBegin();
        for (; it != map.constEnd(); ++it)
            if (!it.value()->ref.deref())
                delete it.value();
    }
    map.clear();
}